

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

int dotClassIndex(int t,float mingap)

{
  int iVar1;
  
  if (t == 0) {
    return (int)(mingap <= HighGoodCut);
  }
  if (t < 0) {
    iVar1 = 3;
    if ((mingap <= LowGoodCut) && (iVar1 = 4, LworseOverlap == '\x01')) {
      return WorseBumpCut < mingap ^ 5;
    }
  }
  else {
    iVar1 = 6;
    if (LweakHbonds == '\x01') {
      iVar1 = (uint)(mingap <= 0.0) * 4 + 2;
    }
  }
  return iVar1;
}

Assistant:

int dotClassIndex(int t, float mingap)
{
   int idx = 0;
    
   // Old code for old definition
   //if      (t == 0) { idx = (mingap > HighGoodCut) ? 0 : 1; } /* contact */
   //else if (t  < 0) { idx = (mingap >  LowGoodCut) ? 2 : 3; } /* clash   */
   //else if (LweakHbonds)
   //{
   //        if (t==1) {idx = 4;                     } /*good hbond*/
   //        else      {idx = 5;                     } /*weak hbond 20111215dcr*/
   //}
   //else             { idx = 4;                              } /* hbonds  */
   
   /* new code SJ 04/10/2105 to implement the new definiion above*/
    if (t == 0) { /* contact */
        if (mingap > HighGoodCut)
            idx = 0; /* wide contact*/
        else
            idx = 1; /* close contact*/
    }
    else if(t < 0){ /* clash*/
        if (mingap > LowGoodCut)
            idx = 3; /* small overlap*/
        else if(LworseOverlap) /* divide bad and worse overlap only if this is true*/
        {
            if(mingap > WorseBumpCut)
                idx = 4; /* bad overlap */
            else
                idx = 5; /* worse overlap */
        }
        else
            idx = 4; /* bad overlap*/
    }
    else{ /* H bond */
        if(LweakHbonds){/* divide H bonds into weak only if this is true.*/
            if(mingap > 0)
                idx = 2; /* weak H bond*/
            else
                idx = 6; /* H bonds*/
        }
        else
            idx = 6; /* H bonds*/
    }
    return idx;
}